

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O2

Float __thiscall pbrt::RGBSigmoidPolynomial::MaxValue(RGBSigmoidPolynomial *this)

{
  undefined1 auVar1 [16];
  float fVar2;
  Float FVar3;
  undefined1 auVar4 [64];
  initializer_list<float> __l;
  Float local_1c;
  Float local_18;
  Float local_14;
  undefined1 extraout_var [60];
  
  fVar2 = this->c0;
  if (fVar2 < 0.0) {
    auVar1._8_4_ = 0x80000000;
    auVar1._0_8_ = 0x8000000080000000;
    auVar1._12_4_ = 0x80000000;
    auVar1 = vxorps_avx512vl(ZEXT416((uint)this->c1),auVar1);
    fVar2 = auVar1._0_4_ / (fVar2 + fVar2);
    if ((360.0 <= fVar2) && (fVar2 <= 830.0)) {
      local_1c = operator()(this,fVar2);
      local_18 = operator()(this,360.0);
      local_14 = operator()(this,830.0);
      __l._M_len = 3;
      __l._M_array = &local_1c;
      fVar2 = std::max<float>(__l);
      return fVar2;
    }
  }
  FVar3 = operator()(this,360.0);
  auVar4._0_4_ = operator()(this,830.0);
  auVar4._4_60_ = extraout_var;
  auVar1 = vmaxss_avx(auVar4._0_16_,ZEXT416((uint)FVar3));
  return auVar1._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float MaxValue() const {
        if (c0 < 0) {
            Float lambda = -c1 / (2 * c0);
            if (lambda >= 360 && lambda <= 830)
                return std::max({(*this)(lambda), (*this)(360), (*this)(830)});
        }
        return std::max((*this)(360), (*this)(830));
    }